

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ann.cpp
# Opt level: O0

void __thiscall ANN::insert_layer(ANN *this,initializer_list<unsigned_int> *n_perceptrons)

{
  const_iterator puVar1;
  uint *local_28;
  const_iterator it;
  uint i;
  initializer_list<unsigned_int> *n_perceptrons_local;
  ANN *this_local;
  
  it._4_4_ = 0;
  local_28 = std::initializer_list<unsigned_int>::begin(n_perceptrons);
  while( true ) {
    puVar1 = std::initializer_list<unsigned_int>::end(n_perceptrons);
    if (local_28 == puVar1) break;
    insert_layer(this,it._4_4_,*local_28);
    local_28 = local_28 + 1;
    it._4_4_ = it._4_4_ + 1;
  }
  return;
}

Assistant:

void ANN::insert_layer(const std::initializer_list<uint>& n_perceptrons){
    uint i=0;
    for(auto it=n_perceptrons.begin();it!=n_perceptrons.end();++it){
        insert_layer(i++, *it);
    }
}